

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  uint32_t value_00;
  int size;
  CodedOutputStream *output_local;
  MessageLite *value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  value_00 = MessageLite::GetCachedSize(value);
  io::CodedOutputStream::WriteVarint32(output,value_00);
  WriteSubMessageMaybeToArray(value_00,value,output);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  WriteSubMessageMaybeToArray(size, value, output);
}